

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeamStatus.h
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::EmitterBeam::SetBeamStatus(EmitterBeam *this,BeamStatus *BS)

{
  (this->m_BeamStatus).m_ui8BeamStatus = BS->m_ui8BeamStatus;
  return;
}

Assistant:

class KDIS_EXPORT BeamStatus : public DataTypeBase
{
protected:

    KUINT8 m_ui8BeamStatus; //bit 0 - BeamState, bits 1-7 - padding

public:

    static const KUINT16 BEAM_STATUS_SIZE = 1;

    BeamStatus();

    BeamStatus(KDataStream &stream) noexcept(false);

    BeamStatus( BeamState BS );

    virtual ~BeamStatus();

    //************************************
    // FullName:    KDIS::DATA_TYPE::BeamStatus::SetBeamState
    //              KDIS::DATA_TYPE::BeamStatus::GetBeamState
    // Description: Beam State.
    // Parameter:   BeamState BS, void
    //************************************
    void SetBeamState( BeamState BS );
    BeamState GetBeamState() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::BeamStatus::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::BeamStatus::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::BeamStatus::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const BeamStatus & Value ) const;
    KBOOL operator != ( const BeamStatus & Value ) const;
}